

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall
Js::DebuggerScope::AreAllPropertiesInDeadZone(DebuggerScope *this,int byteCodeOffset)

{
  int iVar1;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  pLVar2 = (this->scopeProperties).ptr;
  if ((pLVar2 != (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)0x0) &&
     (0 < (pLVar2->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>)
          .count)) {
    iVar1 = (pLVar2->
            super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).count;
    if (iVar1 < 1) {
      return iVar1 < 1;
    }
    bVar3 = DebuggerScopeProperty::IsInDeadZone
                      ((pLVar2->
                       super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>
                       ).buffer.ptr,byteCodeOffset);
    if (bVar3) {
      lVar6 = 0;
      lVar5 = 0x10;
      do {
        lVar6 = lVar6 + 1;
        lVar4 = (long)(pLVar2->
                      super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>
                      ).count;
        if (lVar4 <= lVar6) {
          return lVar4 <= lVar6;
        }
        bVar3 = DebuggerScopeProperty::IsInDeadZone
                          ((DebuggerScopeProperty *)
                           ((long)&((pLVar2->
                                    super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>
                                    ).buffer.ptr)->propId + lVar5),byteCodeOffset);
        lVar5 = lVar5 + 0x10;
      } while (bVar3);
      return lVar4 <= lVar6;
    }
  }
  return false;
}

Assistant:

bool DebuggerScope::AreAllPropertiesInDeadZone(int byteCodeOffset) const
    {
        if (!this->HasProperties())
        {
            return false;
        }

        return this->scopeProperties->All([&](Js::DebuggerScopeProperty& propertyItem)
            {
                return propertyItem.IsInDeadZone(byteCodeOffset);
            });
    }